

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

boolean ok_gend(int rolenum,int racenum,int gendnum,int alignnum)

{
  ushort local_22;
  int local_20;
  short allow;
  int i;
  int alignnum_local;
  int gendnum_local;
  int racenum_local;
  int rolenum_local;
  
  if ((gendnum < 0) || (1 < gendnum)) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    }
    racenum_local._3_1_ = '\0';
  }
  else {
    local_22 = genders[gendnum].allow;
    if ((-1 < rolenum) && (rolenum < 0xe)) {
      local_22 = local_22 & roles[rolenum].allow;
    }
    if ((-1 < racenum) && (racenum < 6)) {
      local_22 = local_22 & races[racenum].allow;
    }
    if (((int)(short)local_22 & 0xf000U) == 0) {
      racenum_local._3_1_ = '\0';
    }
    else {
      racenum_local._3_1_ = '\x01';
    }
  }
  return racenum_local._3_1_;
}

Assistant:

boolean ok_gend(int rolenum, int racenum, int gendnum, int alignnum)
{
    int i;
    short allow;

    if (gendnum >= 0 && gendnum < ROLE_GENDERS) {
	allow = genders[gendnum].allow;

	if (rolenum >= 0 && rolenum < SIZE(roles)-1)
	    allow &= roles[rolenum].allow;
	if (racenum >= 0 && racenum < SIZE(races)-1)
	    allow &= races[racenum].allow;

	if (!(allow & ROLE_GENDMASK))
	    return FALSE;
	return TRUE;
    } else {
	for (i = 0; i < ROLE_GENDERS; i++) {
	    allow = genders[i].allow;

	    if (rolenum >= 0 && rolenum < SIZE(roles)-1)
		allow &= roles[rolenum].allow;
	    if (racenum >= 0 && racenum < SIZE(races)-1)
		allow &= races[racenum].allow;
		continue;

	    if (allow & ROLE_GENDMASK)
		return TRUE;
	}
	return FALSE;
    }
}